

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase267::run(TestCase267 *this)

{
  bool bVar1;
  Bounded<255UL,_unsigned_char> BVar2;
  SafeUnwrapper<255UL,_unsigned_char> SVar3;
  bool local_6c;
  bool local_6b;
  Iterator local_66;
  Iterator local_65;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Range<unsigned_char> local_62;
  Bounded<255UL,_unsigned_char> value_2;
  Bounded<255UL,_unsigned_char> i_2;
  Iterator __end2_2;
  Iterator __begin2_2;
  Range<kj::Bounded<255UL,_unsigned_char>_> *__range2_2;
  Iterator local_4d;
  Iterator local_4c;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  Bounded<255UL,_unsigned_char> value_1;
  Bounded<255UL,_unsigned_char> i_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Range<kj::Bounded<255UL,_unsigned_char>_> *pRStack_48;
  Range<kj::Bounded<255UL,_unsigned_char>_> *__range2_1;
  Bounded<10UL,_unsigned_int> BStack_38;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Bounded<10UL,_unsigned_char> value;
  Bounded<10UL,_unsigned_int> i;
  Iterator __end2;
  Iterator __begin2;
  Range<kj::Bounded<10UL,_unsigned_int>_> *__range2;
  uint expected;
  TestCase267 *this_local;
  
  __range2._4_4_ = 0;
  bounded<10u>();
  ___begin2 = (Range<unsigned_int>)zeroTo<10u>();
  i.value = (uint)Range<kj::Bounded<10UL,_unsigned_int>_>::begin
                            ((Range<kj::Bounded<10UL,_unsigned_int>_> *)&__begin2);
  __kj_shouldLog =
       Range<kj::Bounded<10UL,_unsigned_int>_>::end
                 ((Range<kj::Bounded<10UL,_unsigned_int>_> *)&__begin2);
  while (bVar1 = Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator!=
                           ((Iterator *)&i,(Iterator *)&_kj_shouldLog), bVar1) {
    BStack_38 = Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator*((Iterator *)&i);
    Bounded<10ul,unsigned_char>::Bounded<10ul,unsigned_int>
              ((Bounded<10ul,unsigned_char> *)((long)&__range2_1 + 7),&stack0xffffffffffffffc8);
    __range2_1._5_1_ = __range2_1._7_1_;
    __range2_1._6_1_ = unbound<10ul,unsigned_char>(__range2_1._7_1_);
    bVar1 = kj::operator==(__range2_1._6_1_,__range2._4_4_);
    if (!bVar1) {
      __range2_1._4_1_ = _::Debug::shouldLog(ERROR);
      while ((bool)__range2_1._4_1_ != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x10f,ERROR,"\"failed: expected \" \"unbound(value) == expected++\"",
                   (char (*) [46])"failed: expected unbound(value) == expected++");
        __range2_1._4_1_ = false;
      }
    }
    Range<kj::Bounded<10UL,_unsigned_int>_>::Iterator::operator++((Iterator *)&i);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  if (__range2._4_4_ != 10) {
    __range2_1._3_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)__range2_1._3_1_ != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x111,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      __range2_1._3_1_ = false;
    }
  }
  __range2._4_4_ = 0;
  _kj_shouldLog_3 = (bool)bounded<unsigned_char>('\n');
  __kj_shouldLog_2 =
       (Range<unsigned_char>)
       zeroTo<kj::Bounded<255ul,unsigned_char>>((Bounded<255UL,_unsigned_char>)_kj_shouldLog_3);
  pRStack_48 = (Range<kj::Bounded<255UL,_unsigned_char>_> *)&_kj_shouldLog_2;
  local_4c = Range<kj::Bounded<255UL,_unsigned_char>_>::begin(pRStack_48);
  local_4d = Range<kj::Bounded<255UL,_unsigned_char>_>::end(pRStack_48);
  while (bVar1 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator!=
                           (&local_4c,&local_4d), bVar1) {
    BVar2 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator*(&local_4c);
    SVar3 = unbound<255ul,unsigned_char>(BVar2);
    bVar1 = kj::operator==(SVar3,__range2._4_4_);
    if (!bVar1) {
      __range2_2._6_1_ = _::Debug::shouldLog(ERROR);
      while (__range2_2._6_1_ != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x116,ERROR,"\"failed: expected \" \"unbound(value) == expected++\"",
                   (char (*) [46])"failed: expected unbound(value) == expected++");
        __range2_2._6_1_ = false;
      }
    }
    Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator++(&local_4c);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  if (__range2._4_4_ != 10) {
    __range2_2._5_1_ = _::Debug::shouldLog(ERROR);
    while (__range2_2._5_1_ != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x118,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      __range2_2._5_1_ = false;
    }
  }
  __range2._4_4_ = 3;
  _kj_shouldLog_4 = (bool)bounded<unsigned_char>('\x03');
  _kj_shouldLog_5 = (bool)bounded<unsigned_char>('\n');
  local_62 = (Range<unsigned_char>)
             range<kj::Bounded<255ul,unsigned_char>>
                       ((Bounded<255UL,_unsigned_char>)_kj_shouldLog_4,
                        (Bounded<255UL,_unsigned_char>)_kj_shouldLog_5);
  _value_2 = &local_62;
  local_65 = Range<kj::Bounded<255UL,_unsigned_char>_>::begin
                       ((Range<kj::Bounded<255UL,_unsigned_char>_> *)_value_2);
  local_66 = Range<kj::Bounded<255UL,_unsigned_char>_>::end
                       ((Range<kj::Bounded<255UL,_unsigned_char>_> *)_value_2);
  while (bVar1 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator!=
                           (&local_65,&local_66), bVar1) {
    BVar2 = Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator*(&local_65);
    SVar3 = unbound<255ul,unsigned_char>(BVar2);
    bVar1 = kj::operator==(SVar3,__range2._4_4_);
    if (!bVar1) {
      local_6b = _::Debug::shouldLog(ERROR);
      while (local_6b != false) {
        _::Debug::log<char_const(&)[46]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x11d,ERROR,"\"failed: expected \" \"unbound(value) == expected++\"",
                   (char (*) [46])"failed: expected unbound(value) == expected++");
        local_6b = false;
      }
    }
    Range<kj::Bounded<255UL,_unsigned_char>_>::Iterator::operator++(&local_65);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  if (__range2._4_4_ != 10) {
    local_6c = _::Debug::shouldLog(ERROR);
    while (local_6c != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x11f,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      local_6c = false;
    }
  }
  return;
}

Assistant:

TEST(UnitMeasure, BoundedRange) {
  uint expected = 0;
  for (auto i: zeroTo(bounded<10>())) {
    Bounded<10, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3), bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);
}